

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

bool __thiscall
Rml::Element::Animate
          (Element *this,String *property_name,Property *target_value,float duration,Tween tween,
          int num_iterations,bool alternate_direction,float delay,Property *start_value)

{
  PropertyId property_id;
  bool bVar1;
  iterator __position;
  bool bVar2;
  
  property_id = StyleSheetSpecification::GetPropertyId(property_name);
  bVar2 = false;
  __position = StartAnimation(this,property_id,start_value,num_iterations,alternate_direction,delay,
                              false);
  if (__position._M_current !=
      (this->animations).
      super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar1 = ElementAnimation::AddKey(__position._M_current,duration,target_value,this,tween,true);
    bVar2 = true;
    if (!bVar1) {
      ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::erase
                (&this->animations,(const_iterator)__position._M_current);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool Element::Animate(const String& property_name, const Property& target_value, float duration, Tween tween, int num_iterations,
	bool alternate_direction, float delay, const Property* start_value)
{
	bool result = false;
	PropertyId property_id = StyleSheetSpecification::GetPropertyId(property_name);

	auto it_animation = StartAnimation(property_id, start_value, num_iterations, alternate_direction, delay, false);
	if (it_animation != animations.end())
	{
		result = it_animation->AddKey(duration, target_value, *this, tween, true);
		if (!result)
			animations.erase(it_animation);
	}

	return result;
}